

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdEmuD3D0Config::is_valid_val(MthdEmuD3D0Config *this)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((uVar1 & 0x4200) == 0 && (uVar1 & 0x3000) != 0) {
    bVar2 = false;
    if ((((uVar1 & 0xf000000) < 0x4000001) && (bVar2 = false, (uVar1 & 0xf00000) < 0x400001)) &&
       (0xfffffffffffffff7 < (ulong)(uVar1 >> 0x10 & 0xf) - 9)) {
      bVar2 = (uVar1 & 0xf) < 3;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 9, 1))
			return false;
		if (!extr(val, 12, 2))
			return false;
		if (extr(val, 14, 1))
			return false;
		if (extr(val, 16, 4) < 1 || extr(val, 16, 4) > 8)
			return false;
		if (extr(val, 20, 4) > 4)
			return false;
		if (extr(val, 24, 4) > 4)
			return false;
		if (extr(val, 0, 4) > 2)
			return false;
		return true;
	}